

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

void __thiscall
AccountingTestMemoryAllocator::free_memory
          (AccountingTestMemoryAllocator *this,char *memory,size_t param_2,char *file,size_t line)

{
  size_t size;
  
  size = removeMemoryFromTrackingAndReturnAllocatedSize(this,memory);
  MemoryAccountant::dealloc(this->accountant_,size);
  (*this->originalAllocator_->_vptr_TestMemoryAllocator[3])
            (this->originalAllocator_,memory,size,file,line);
  return;
}

Assistant:

void AccountingTestMemoryAllocator::free_memory(char* memory, size_t, const char* file, size_t line)
{
    size_t size = removeMemoryFromTrackingAndReturnAllocatedSize(memory);
    accountant_.dealloc(size);
    originalAllocator_->free_memory(memory, size, file, line);
}